

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O2

HRESULT Js::JavascriptError::GetRuntimeError(RecyclableObject *errorObject,LPCWSTR *pMessage)

{
  ScriptContext *requestContext;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  JavascriptError *pJVar10;
  double dVar11;
  char16_t *pcVar9;
  
  requestContext =
       (((((errorObject->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (requestContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0x225,"(scriptContext->GetThreadContext()->IsScriptActive())",
                                "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pvVar7 = JavascriptOperators::GetPropertyNoCache(errorObject,0x10c,requestContext);
  bVar2 = TaggedInt::Is(pvVar7);
  if (bVar2) {
    uVar3 = TaggedInt::ToInt32(pvVar7);
  }
  else {
    uVar4 = 0x800a139e;
    if ((ulong)pvVar7 >> 0x32 == 0) goto LAB_00a82084;
    dVar11 = JavascriptNumber::GetValue(pvVar7);
    uVar3 = (uint)dVar11;
  }
  uVar4 = 0x80004005;
  if ((int)uVar3 < 0) {
    uVar4 = uVar3;
  }
LAB_00a82084:
  if (pMessage == (LPCWSTR *)0x0) {
    return uVar4;
  }
  *pMessage = L"";
  pvVar7 = JavascriptOperators::GetProperty
                     (errorObject,0x102,requestContext,(PropertyValueInfo *)0x0);
  bVar2 = VarIs<Js::JavascriptString>(pvVar7);
  if (bVar2) {
    pJVar8 = VarTo<Js::JavascriptString>(pvVar7);
    iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar8);
    pcVar9 = (char16_t *)CONCAT44(extraout_var,iVar5);
  }
  else {
    bVar2 = VarIsImpl<Js::JavascriptError>(errorObject);
    if ((bVar2) &&
       (pJVar10 = VarTo<Js::JavascriptError,Js::RecyclableObject>(errorObject),
       (pJVar10->originalRuntimeErrorMessage).ptr != (char16_t *)0x0)) {
      pJVar10 = VarTo<Js::JavascriptError,Js::RecyclableObject>(errorObject);
      pcVar9 = (pJVar10->originalRuntimeErrorMessage).ptr;
    }
    else {
      if ((uVar4 & 0x1fff0000) != 0xa0000) {
        return uVar4;
      }
      pcVar9 = (char16_t *)0x0;
    }
  }
  *pMessage = pcVar9;
  return uVar4;
}

Assistant:

HRESULT JavascriptError::GetRuntimeError(RecyclableObject* errorObject, __out_opt LPCWSTR * pMessage)
    {
        // Only report the error number if it is a runtime error
        HRESULT hr = JSERR_UncaughtException;
        ScriptContext* scriptContext = errorObject->GetScriptContext();

        // This version needs to be called in script.
        Assert(scriptContext->GetThreadContext()->IsScriptActive());

        Var number = JavascriptOperators::GetPropertyNoCache(errorObject, Js::PropertyIds::number, scriptContext);
        if (TaggedInt::Is(number))
        {
            hr = TaggedInt::ToInt32(number);
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(number))
        {
            hr = (HRESULT)JavascriptNumber::GetValue(number);
        }
        if (!FAILED(hr))
        {
            hr = E_FAIL;
        }

        if (pMessage != NULL)
        {
            *pMessage = _u("");  // default empty-string

            // The message property always overrides any error message
            Var message = Js::JavascriptOperators::GetProperty(errorObject, Js::PropertyIds::message, scriptContext, NULL);
            if (VarIs<JavascriptString>(message))
            {
                // Always report the description to IE if it is a string, even if the user sets it
                JavascriptString * messageString = VarTo<JavascriptString>(message);
                *pMessage = messageString->GetSz();
            }
            else if (Js::VarIs<Js::JavascriptError>(errorObject) && Js::VarTo<Js::JavascriptError>(errorObject)->originalRuntimeErrorMessage != nullptr)
            {
                // use the runtime error message
                *pMessage = Js::VarTo<Js::JavascriptError>(errorObject)->originalRuntimeErrorMessage;
            }
            else if (FACILITY_CONTROL == HRESULT_FACILITY(hr))
            {
                // User might have create it's own Error object with JS error code, try to load the
                // resource string from the HResult by returning null;
                *pMessage = nullptr;
            }
        }

        // If neither the message or original runtime error message is set, and there are no error message.
        // Then just return false and we will report Uncaught exception
        return hr;
    }